

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::packRows(CLUFactor<double> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  undefined8 *puVar7;
  long in_RDI;
  int *l_rbeg;
  int *l_rmax;
  int *l_rlen;
  double *l_rval;
  int *l_ridx;
  Dring *list;
  Dring *ring;
  int l_row;
  int j;
  int i;
  int n;
  undefined8 *local_20;
  int local_10;
  int local_c;
  
  lVar1 = *(long *)(in_RDI + 0x138);
  pdVar6 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x258a7e);
  lVar2 = *(long *)(in_RDI + 0x148);
  lVar3 = *(long *)(in_RDI + 0x150);
  lVar4 = *(long *)(in_RDI + 0x140);
  local_c = 0;
  puVar7 = (undefined8 *)(in_RDI + 0xf8);
  for (local_20 = (undefined8 *)*puVar7; local_20 != puVar7; local_20 = (undefined8 *)*local_20) {
    iVar5 = *(int *)(local_20 + 2);
    if (*(int *)(lVar4 + (long)iVar5 * 4) != local_c) goto LAB_00258b03;
    local_c = *(int *)(lVar2 + (long)iVar5 * 4) + local_c;
    *(undefined4 *)(lVar3 + (long)iVar5 * 4) = *(undefined4 *)(lVar2 + (long)iVar5 * 4);
  }
LAB_00258c1c:
  *(undefined4 *)(*(long *)(in_RDI + 0x150) + (long)*(int *)(in_RDI + 4) * 4) = 0;
  *(int *)(in_RDI + 0x11c) = local_c;
  return;
LAB_00258b03:
  do {
    iVar5 = *(int *)(local_20 + 2);
    local_10 = *(int *)(lVar4 + (long)iVar5 * 4);
    *(int *)(lVar4 + (long)iVar5 * 4) = local_c;
    *(undefined4 *)(lVar3 + (long)iVar5 * 4) = *(undefined4 *)(lVar2 + (long)iVar5 * 4);
    iVar5 = local_10 + *(int *)(lVar2 + (long)iVar5 * 4);
    for (; local_10 < iVar5; local_10 = local_10 + 1) {
      *(undefined4 *)(lVar1 + (long)local_c * 4) = *(undefined4 *)(lVar1 + (long)local_10 * 4);
      pdVar6[local_c] = pdVar6[local_10];
      local_c = local_c + 1;
    }
    local_20 = (undefined8 *)*local_20;
  } while (local_20 != puVar7);
  goto LAB_00258c1c;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}